

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall Centaurus::CharClass<char>::append(CharClass<char> *this,Range<char> *r)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  reference pvVar4;
  Range<char> *r_local;
  CharClass<char> *this_local;
  
  bVar1 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::empty
                    (&this->m_ranges);
  if (bVar1) {
    std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::push_back
              (&this->m_ranges,r);
  }
  else {
    pvVar4 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::back
                       (&this->m_ranges);
    cVar2 = Range<char>::end(pvVar4);
    cVar3 = Range<char>::start(r);
    if (cVar2 == cVar3) {
      pvVar4 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::back
                         (&this->m_ranges);
      cVar2 = Range<char>::end(r);
      Range<char>::end(pvVar4,cVar2);
    }
    else {
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::push_back
                (&this->m_ranges,r);
    }
  }
  return;
}

Assistant:

void append(const Range<TCHAR>& r)
    {
        if (m_ranges.empty())
        {
            m_ranges.push_back(r);
        }
        else
        {
            if (m_ranges.back().end() == r.start())
            {
                m_ranges.back().end(r.end());
            }
            else
            {
                m_ranges.push_back(r);
            }
        }
    }